

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [32];
  int outch;
  size_t sVar7;
  int *piVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  Option *opt_00;
  Mat *pMVar28;
  uint uVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  float *pfVar33;
  long lVar34;
  ulong uVar35;
  uint uVar36;
  undefined1 (*pauVar37) [32];
  undefined1 (*pauVar38) [32];
  long lVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  float *pfVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [12];
  undefined1 auVar48 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  long local_458;
  ulong local_450;
  undefined1 local_440 [16];
  Mat local_420;
  long local_3d0;
  void *local_3c8;
  ulong local_3c0;
  ulong local_3b8;
  ulong local_3b0;
  ulong local_3a8;
  int local_39c;
  int local_398;
  int local_394;
  Mat local_390;
  Option *local_340;
  Mat *local_338;
  Mat local_330;
  Mat local_2e0;
  Mat *local_290;
  size_t local_288;
  Mat *local_280;
  long local_278;
  undefined1 local_270 [16];
  float afStack_260 [8];
  float afStack_240 [8];
  undefined1 auStack_220 [32];
  float afStack_200 [8];
  float afStack_1e0 [64];
  undefined1 auStack_e0 [128];
  undefined1 auStack_60 [48];
  
  iVar30 = bottom_blob->c;
  sVar7 = bottom_blob->elemsize;
  iVar31 = bottom_blob->elempack;
  uVar2 = top_blob->w;
  uVar4 = top_blob->h;
  auVar45._4_4_ = uVar4;
  auVar45._0_4_ = uVar2;
  outch = top_blob->c;
  piVar8 = bottom_blob->refcount;
  local_390.data = bottom_blob->data;
  local_390.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_390.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_390.elemsize._0_4_ = (undefined4)sVar7;
  local_390.elemsize._4_4_ = (undefined4)(sVar7 >> 0x20);
  local_390.allocator = bottom_blob->allocator;
  auVar46._0_4_ = bottom_blob->dims;
  auVar46._4_4_ = bottom_blob->w;
  auVar46._8_4_ = bottom_blob->h;
  auVar46._12_4_ = bottom_blob->d;
  local_390.cstep = bottom_blob->cstep;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + 1;
    UNLOCK();
  }
  auVar50 = vpcmpeqd_avx(auVar46,auVar46);
  auVar45._8_8_ = 0;
  auVar45 = vpsubd_avx(auVar45,auVar50);
  auVar50 = vpsrld_avx(auVar45,0x1f);
  local_440 = vpaddd_avx(auVar45,auVar50);
  auVar52 = ZEXT1664(local_440);
  auVar50._8_4_ = 0xfffffffe;
  auVar50._0_8_ = 0xfffffffefffffffe;
  auVar50._12_4_ = 0xfffffffe;
  local_270 = vpand_avx(local_440,auVar50);
  local_398 = local_270._0_4_;
  local_39c = local_270._4_4_;
  local_390.elempack = iVar31;
  local_390.dims = auVar46._0_4_;
  local_390.w = auVar46._4_4_;
  local_390.h = auVar46._8_4_;
  local_390.d = auVar46._12_4_;
  local_390.c = iVar30;
  local_290 = bias;
  local_280 = kernel_tm;
  copy_make_border(bottom_blob,&local_390,0,(local_39c - bottom_blob->h) + 2,0,
                   (local_398 - bottom_blob->w) + 2,0,0.0,opt);
  auVar46 = vpsrad_avx(local_440,1);
  local_330.cstep = 0;
  local_330.data = (void *)0x0;
  local_330.refcount._0_4_ = 0;
  local_330.refcount._4_4_ = 0;
  local_330.elemsize._0_4_ = 0;
  local_330.elemsize._4_4_ = 0;
  local_330.elempack = 0;
  local_330.allocator = (Allocator *)0x0;
  local_330.dims = 0;
  local_330.w = 0;
  local_330.h = 0;
  local_330.d = 0;
  local_330.c = 0;
  local_394 = iVar31;
  local_340 = opt;
  local_338 = top_blob;
  local_288 = sVar7;
  Mat::create(&local_330,auVar46._4_4_ * auVar46._0_4_,0x10,iVar30,sVar7,iVar31,
              opt->workspace_allocator);
  sVar7 = local_288;
  pMVar28 = local_338;
  opt_00 = local_340;
  iVar30 = local_394;
  auVar46 = auVar52._0_16_;
  if (0 < (long)local_390.c) {
    local_3a8 = (ulong)(uint)local_390.w;
    local_3c0 = (ulong)(uint)local_390.h;
    uVar36 = (local_390.h - ((int)(local_390.h - 2U) >> 0x1f)) + -2 >> 1;
    uVar29 = (local_390.w - ((int)(local_390.w - 2U) >> 0x1f)) + -2 >> 1;
    iVar31 = uVar29 * uVar36;
    uVar43 = 1;
    if (1 < (int)uVar29) {
      uVar43 = (ulong)uVar29;
    }
    if ((int)uVar36 < 2) {
      uVar36 = 1;
    }
    local_3b0 = (ulong)uVar36;
    local_3b8 = (long)(int)uVar29 * 0x20;
    local_3c8 = (void *)((long)(iVar31 * 8) * 4);
    local_278 = (long)(iVar31 * 0x18) * 4;
    local_3d0 = (long)(iVar31 * 0x10) * 4;
    local_458 = 0;
    do {
      if (3 < local_390.h) {
        local_440._0_8_ =
             (long)local_390.data +
             CONCAT44(local_390.elemsize._4_4_,(undefined4)local_390.elemsize) * local_390.cstep *
             local_458 + 0x60;
        lVar41 = CONCAT44(local_330.elemsize._4_4_,(undefined4)local_330.elemsize) * local_330.cstep
                 * local_458;
        lVar32 = 0;
        uVar35 = 0;
        do {
          if (3 < local_390.w) {
            uVar42 = 0;
            lVar34 = lVar32;
            pauVar37 = (undefined1 (*) [32])local_440._0_8_;
            do {
              lVar40 = -0x80;
              pauVar38 = pauVar37;
              do {
                auVar48 = pauVar38[-2];
                auVar6 = pauVar38[-1];
                auVar51 = vsubps_avx(pauVar38[-3],auVar6);
                auVar54 = vsubps_avx(auVar6,auVar48);
                auVar53 = vsubps_avx(*pauVar38,auVar48);
                *(undefined1 (*) [32])((long)afStack_1e0 + lVar40) = auVar51;
                *(float *)((long)afStack_1e0 + lVar40 + 0x80) = auVar6._0_4_ + auVar48._0_4_;
                *(float *)((long)afStack_1e0 + lVar40 + 0x84) = auVar6._4_4_ + auVar48._4_4_;
                *(float *)((long)afStack_1e0 + lVar40 + 0x88) = auVar6._8_4_ + auVar48._8_4_;
                *(float *)((long)afStack_1e0 + lVar40 + 0x8c) = auVar6._12_4_ + auVar48._12_4_;
                *(float *)((long)afStack_1e0 + lVar40 + 0x90) = auVar6._16_4_ + auVar48._16_4_;
                *(float *)((long)afStack_1e0 + lVar40 + 0x94) = auVar6._20_4_ + auVar48._20_4_;
                *(float *)((long)afStack_1e0 + lVar40 + 0x98) = auVar6._24_4_ + auVar48._24_4_;
                *(float *)((long)afStack_1e0 + lVar40 + 0x9c) = auVar6._28_4_ + auVar48._28_4_;
                *(undefined1 (*) [32])(auStack_e0 + lVar40) = auVar54;
                *(undefined1 (*) [32])(auStack_60 + lVar40) = auVar53;
                pauVar38 = (undefined1 (*) [32])(*pauVar38 + (long)(local_390.w * 8) * 4);
                lVar40 = lVar40 + 0x20;
              } while (lVar40 != 0);
              lVar39 = 0;
              lVar40 = lVar34;
              do {
                auVar48 = *(undefined1 (*) [32])((long)afStack_240 + lVar39);
                auVar6 = *(undefined1 (*) [32])(auStack_220 + lVar39);
                auVar51 = vsubps_avx(*(undefined1 (*) [32])((long)afStack_260 + lVar39),auVar6);
                auVar54._0_4_ = auVar6._0_4_ + auVar48._0_4_;
                auVar54._4_4_ = auVar6._4_4_ + auVar48._4_4_;
                auVar54._8_4_ = auVar6._8_4_ + auVar48._8_4_;
                auVar54._12_4_ = auVar6._12_4_ + auVar48._12_4_;
                auVar54._16_4_ = auVar6._16_4_ + auVar48._16_4_;
                auVar54._20_4_ = auVar6._20_4_ + auVar48._20_4_;
                auVar54._24_4_ = auVar6._24_4_ + auVar48._24_4_;
                auVar54._28_4_ = auVar6._28_4_ + auVar48._28_4_;
                auVar6 = vsubps_avx(auVar6,auVar48);
                auVar48 = vsubps_avx(*(undefined1 (*) [32])((long)afStack_200 + lVar39),auVar48);
                auVar52 = ZEXT3264(auVar48);
                *(undefined1 (*) [32])((long)local_330.data + lVar40 + lVar41) = auVar51;
                *(undefined1 (*) [32])((long)local_330.data + (long)local_3c8 + lVar40 + lVar41) =
                     auVar54;
                *(undefined1 (*) [32])((long)local_330.data + lVar40 + local_3d0 + lVar41) = auVar6;
                *(undefined1 (*) [32])((long)local_330.data + lVar40 + local_278 + lVar41) = auVar48
                ;
                lVar39 = lVar39 + 0x80;
                lVar40 = lVar40 + (long)(iVar31 * 0x20) * 4;
              } while (lVar39 != 0x200);
              uVar42 = uVar42 + 1;
              pauVar37 = pauVar37 + 2;
              lVar34 = lVar34 + 0x20;
            } while (uVar42 != uVar43);
          }
          uVar35 = uVar35 + 1;
          local_440._0_8_ =
               (undefined1 *)local_440._0_8_ +
               (long)local_390.w * CONCAT44(local_390.elemsize._4_4_,(undefined4)local_390.elemsize)
               * 2;
          lVar32 = lVar32 + local_3b8;
        } while (uVar35 != local_3b0);
      }
      auVar46 = auVar52._0_16_;
      local_458 = local_458 + 1;
    } while (local_458 != local_390.c);
  }
  piVar8 = (int *)CONCAT44(local_390.refcount._4_4_,local_390.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_390.allocator == (Allocator *)0x0) {
        if (local_390.data != (void *)0x0) {
          free(local_390.data);
        }
      }
      else {
        (*(local_390.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_390.cstep = 0;
  local_390.data = (void *)0x0;
  local_390.refcount._0_4_ = 0;
  local_390.refcount._4_4_ = 0;
  local_390.elemsize._0_4_ = 0;
  local_390.elemsize._4_4_ = 0;
  local_390.elempack = 0;
  local_390.h = 0;
  local_390.d = 0;
  local_390.c = 0;
  local_390.allocator = (Allocator *)0x0;
  local_390.dims = 0;
  local_390.w = 0;
  local_2e0.cstep = 0;
  local_2e0.data = (void *)0x0;
  local_2e0.refcount._0_4_ = 0;
  local_2e0.refcount._4_4_ = 0;
  local_2e0.elemsize = 0;
  local_2e0.elempack = 0;
  local_2e0.allocator = (Allocator *)0x0;
  local_2e0.dims = 0;
  local_2e0.w = 0;
  local_2e0.h = 0;
  local_2e0.d = 0;
  local_2e0.c = 0;
  convolution_winograd_dot_pack8_avx(&local_330,outch,local_280,&local_2e0,opt_00);
  local_420.cstep = 0;
  local_420.data = (void *)0x0;
  local_420.refcount._0_4_ = 0;
  local_420.refcount._4_4_ = 0;
  local_420.elemsize._0_4_ = 0;
  local_420.elemsize._4_4_ = 0;
  local_420.elempack = 0;
  local_420.allocator = (Allocator *)0x0;
  local_420.dims = 0;
  local_420.w = 0;
  local_420.h = 0;
  local_420.d = 0;
  local_420.c = 0;
  uVar3 = pMVar28->w;
  uVar5 = pMVar28->h;
  auVar47._4_4_ = uVar5;
  auVar47._0_4_ = uVar3;
  auVar47._8_8_ = 0;
  auVar45 = vpcmpeqd_avx(auVar47,local_270);
  auVar45 = vpmovsxdq_avx(auVar45);
  auVar46 = vpcmpeqd_avx(auVar46,auVar46);
  if (((auVar46 & ~auVar45) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
      -1 < SUB161(auVar46 & ~auVar45,0xf)) {
    if (&local_420 != pMVar28) {
      piVar8 = pMVar28->refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      local_420.data = pMVar28->data;
      local_420.refcount._0_4_ = SUB84(pMVar28->refcount,0);
      local_420.refcount._4_4_ = (undefined4)((ulong)pMVar28->refcount >> 0x20);
      local_420.elemsize._0_4_ = (undefined4)pMVar28->elemsize;
      local_420.elemsize._4_4_ = (undefined4)(pMVar28->elemsize >> 0x20);
      local_420.elempack = pMVar28->elempack;
      local_420.allocator = pMVar28->allocator;
      uVar24 = pMVar28->dims;
      uVar25 = pMVar28->w;
      uVar26 = pMVar28->h;
      uVar27 = pMVar28->d;
      local_420.c = pMVar28->c;
      local_420.cstep = pMVar28->cstep;
      local_420.dims = uVar24;
      local_420.w = uVar25;
      local_420.h = uVar26;
      local_420.d = uVar27;
    }
  }
  else {
    Mat::create(&local_420,local_398,local_39c,outch,sVar7,iVar30,opt_00->workspace_allocator);
  }
  local_3c0 = (ulong)local_420.c;
  if (0 < (long)local_3c0) {
    local_3c8 = local_290->data;
    local_3b0 = (ulong)(uint)local_420.w;
    local_3d0 = CONCAT44(local_3d0._4_4_,local_420.h);
    local_3b8 = (ulong)(uint)(local_420.h / 2);
    uVar36 = local_420.w / 2;
    iVar30 = uVar36 * (local_420.h / 2);
    lVar32 = 0;
    do {
      if (local_3c8 == (void *)0x0) {
        auVar48 = SUB6432(ZEXT864(0),0) << 0x40;
      }
      else {
        auVar48 = *(undefined1 (*) [32])((long)local_3c8 + lVar32 * 0x20);
      }
      if (1 < local_420.h) {
        local_3a8 = (long)local_420.w *
                    CONCAT44(local_420.elemsize._4_4_,(undefined4)local_420.elemsize) * 2;
        local_440._0_8_ =
             (long)local_420.data +
             CONCAT44(local_420.elemsize._4_4_,(undefined4)local_420.elemsize) * local_420.cstep *
             lVar32 + 0x20;
        local_450 = 0;
        uVar43 = 0;
        do {
          if (1 < local_420.w) {
            uVar42 = 0;
            pfVar33 = (float *)local_440._0_8_;
            uVar35 = local_450;
            do {
              pfVar44 = (float *)((long)local_2e0.data +
                                 (uVar35 >> 3 & 0x1fffffff) * 0x20 +
                                 local_2e0.elemsize * local_2e0.cstep * lVar32);
              lVar41 = -0x80;
              do {
                auVar6 = *(undefined1 (*) [32])(pfVar44 + iVar30 * 8);
                auVar51 = *(undefined1 (*) [32])(pfVar44 + iVar30 * 0x10);
                fVar9 = pfVar44[1];
                fVar10 = pfVar44[2];
                fVar11 = pfVar44[3];
                fVar12 = pfVar44[4];
                fVar13 = pfVar44[5];
                fVar14 = pfVar44[6];
                fVar15 = pfVar44[7];
                auVar54 = vsubps_avx(auVar6,auVar51);
                pfVar1 = pfVar44 + iVar30 * 0x18;
                fVar16 = *pfVar1;
                fVar17 = pfVar1[1];
                fVar18 = pfVar1[2];
                fVar19 = pfVar1[3];
                fVar20 = pfVar1[4];
                fVar21 = pfVar1[5];
                fVar22 = pfVar1[6];
                fVar23 = pfVar1[7];
                *(float *)((long)afStack_1e0 + lVar41) = auVar6._0_4_ + *pfVar44 + auVar51._0_4_;
                *(float *)((long)afStack_1e0 + lVar41 + 4) = auVar6._4_4_ + fVar9 + auVar51._4_4_;
                *(float *)((long)afStack_1e0 + lVar41 + 8) = auVar6._8_4_ + fVar10 + auVar51._8_4_;
                *(float *)((long)afStack_1e0 + lVar41 + 0xc) =
                     auVar6._12_4_ + fVar11 + auVar51._12_4_;
                *(float *)((long)afStack_1e0 + lVar41 + 0x10) =
                     auVar6._16_4_ + fVar12 + auVar51._16_4_;
                *(float *)((long)afStack_1e0 + lVar41 + 0x14) =
                     auVar6._20_4_ + fVar13 + auVar51._20_4_;
                *(float *)((long)afStack_1e0 + lVar41 + 0x18) =
                     auVar6._24_4_ + fVar14 + auVar51._24_4_;
                *(float *)((long)afStack_1e0 + lVar41 + 0x1c) =
                     auVar6._28_4_ + fVar15 + auVar51._28_4_;
                *(float *)((long)afStack_1e0 + lVar41 + 0x80) = auVar54._0_4_ + fVar16;
                *(float *)((long)afStack_1e0 + lVar41 + 0x84) = auVar54._4_4_ + fVar17;
                *(float *)((long)afStack_1e0 + lVar41 + 0x88) = auVar54._8_4_ + fVar18;
                *(float *)((long)afStack_1e0 + lVar41 + 0x8c) = auVar54._12_4_ + fVar19;
                *(float *)((long)afStack_1e0 + lVar41 + 0x90) = auVar54._16_4_ + fVar20;
                *(float *)((long)afStack_1e0 + lVar41 + 0x94) = auVar54._20_4_ + fVar21;
                *(float *)((long)afStack_1e0 + lVar41 + 0x98) = auVar54._24_4_ + fVar22;
                *(float *)((long)afStack_1e0 + lVar41 + 0x9c) = auVar54._28_4_ + fVar23;
                pfVar44 = pfVar44 + iVar30 * 0x20;
                lVar41 = lVar41 + 0x20;
              } while (lVar41 != 0);
              lVar41 = 0;
              pfVar44 = pfVar33;
              do {
                auVar51._0_4_ = auVar48._0_4_ + *(float *)((long)afStack_240 + lVar41);
                auVar51._4_4_ = auVar48._4_4_ + *(float *)((long)afStack_240 + lVar41 + 4);
                auVar51._8_4_ = auVar48._8_4_ + *(float *)((long)afStack_240 + lVar41 + 8);
                auVar51._12_4_ = auVar48._12_4_ + *(float *)((long)afStack_240 + lVar41 + 0xc);
                auVar51._16_4_ = auVar48._16_4_ + *(float *)((long)afStack_240 + lVar41 + 0x10);
                auVar51._20_4_ = auVar48._20_4_ + *(float *)((long)afStack_240 + lVar41 + 0x14);
                auVar51._24_4_ = auVar48._24_4_ + *(float *)((long)afStack_240 + lVar41 + 0x18);
                auVar51._28_4_ = auVar48._28_4_ + *(float *)((long)afStack_240 + lVar41 + 0x1c);
                auVar6 = *(undefined1 (*) [32])(auStack_220 + lVar41);
                auVar53._0_4_ =
                     auVar51._0_4_ + *(float *)((long)afStack_260 + lVar41) + auVar6._0_4_;
                auVar53._4_4_ =
                     auVar51._4_4_ + *(float *)((long)afStack_260 + lVar41 + 4) + auVar6._4_4_;
                auVar53._8_4_ =
                     auVar51._8_4_ + *(float *)((long)afStack_260 + lVar41 + 8) + auVar6._8_4_;
                auVar53._12_4_ =
                     auVar51._12_4_ + *(float *)((long)afStack_260 + lVar41 + 0xc) + auVar6._12_4_;
                auVar53._16_4_ =
                     auVar51._16_4_ + *(float *)((long)afStack_260 + lVar41 + 0x10) + auVar6._16_4_;
                auVar53._20_4_ =
                     auVar51._20_4_ + *(float *)((long)afStack_260 + lVar41 + 0x14) + auVar6._20_4_;
                auVar53._24_4_ =
                     auVar51._24_4_ + *(float *)((long)afStack_260 + lVar41 + 0x18) + auVar6._24_4_;
                auVar53._28_4_ =
                     auVar51._28_4_ + *(float *)((long)afStack_240 + lVar41 + -4) + auVar6._28_4_;
                auVar6 = vsubps_avx(auVar51,auVar6);
                fVar9 = *(float *)((long)afStack_200 + lVar41);
                fVar10 = *(float *)((long)afStack_200 + lVar41 + 4);
                fVar11 = *(float *)((long)afStack_200 + lVar41 + 8);
                fVar12 = *(float *)((long)afStack_200 + lVar41 + 0xc);
                fVar13 = *(float *)((long)afStack_200 + lVar41 + 0x10);
                fVar14 = *(float *)((long)afStack_200 + lVar41 + 0x14);
                fVar15 = *(float *)((long)afStack_200 + lVar41 + 0x18);
                fVar16 = *(float *)((long)afStack_200 + lVar41 + 0x1c);
                *(undefined1 (*) [32])(pfVar44 + -8) = auVar53;
                *pfVar44 = auVar6._0_4_ + fVar9;
                pfVar44[1] = auVar6._4_4_ + fVar10;
                pfVar44[2] = auVar6._8_4_ + fVar11;
                pfVar44[3] = auVar6._12_4_ + fVar12;
                pfVar44[4] = auVar6._16_4_ + fVar13;
                pfVar44[5] = auVar6._20_4_ + fVar14;
                pfVar44[6] = auVar6._24_4_ + fVar15;
                pfVar44[7] = auVar6._28_4_ + fVar16;
                lVar41 = lVar41 + 0x80;
                pfVar44 = pfVar44 + local_420.w * 8;
              } while (lVar41 == 0x80);
              uVar42 = uVar42 + 1;
              uVar35 = uVar35 + 8;
              pfVar33 = pfVar33 + 0x10;
            } while (uVar42 != uVar36);
          }
          uVar43 = uVar43 + 1;
          local_450 = local_450 + (ulong)uVar36 * 8;
          local_440._0_8_ = local_440._0_8_ + local_3a8;
        } while (uVar43 != local_3b8);
      }
      lVar32 = lVar32 + 1;
    } while (lVar32 != local_3c0);
  }
  copy_cut_border(&local_420,local_338,0,local_420.h - local_338->h,0,local_420.w - local_338->w,
                  local_340);
  piVar8 = (int *)CONCAT44(local_420.refcount._4_4_,local_420.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_420.allocator == (Allocator *)0x0) {
        if (local_420.data != (void *)0x0) {
          free(local_420.data);
        }
      }
      else {
        (*(local_420.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_420.cstep = 0;
  auVar49 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
  local_420.data = (void *)0x0;
  local_420.refcount._0_4_ = 0;
  local_420.refcount._4_4_ = 0;
  local_420.elemsize._0_4_ = 0;
  local_420.elemsize._4_4_ = 0;
  local_420.elempack = 0;
  local_420.dims = 0;
  local_420.w = 0;
  local_420.h = 0;
  local_420.d = 0;
  local_420.c = 0;
  piVar8 = (int *)CONCAT44(local_2e0.refcount._4_4_,local_2e0.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_2e0.allocator == (Allocator *)0x0) {
        if (local_2e0.data != (void *)0x0) {
          free(local_2e0.data);
          auVar49 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
        }
      }
      else {
        (*(local_2e0.allocator)->_vptr_Allocator[3])();
        auVar49 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
      }
    }
  }
  local_2e0.cstep = 0;
  local_2e0.data = (void *)0x0;
  local_2e0.refcount._0_4_ = auVar49._4_4_;
  local_2e0.refcount._4_4_ = 0;
  local_2e0.elemsize = auVar49._0_8_;
  local_2e0.elempack = auVar49._8_4_;
  local_2e0.w = 0;
  local_2e0._48_8_ = auVar49._4_8_;
  local_2e0.c = 0;
  piVar8 = (int *)CONCAT44(local_330.refcount._4_4_,local_330.refcount._0_4_);
  local_2e0.dims = local_2e0.refcount._4_4_;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_330.allocator == (Allocator *)0x0) {
        if (local_330.data != (void *)0x0) {
          free(local_330.data);
        }
      }
      else {
        (*(local_330.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_330.cstep = 0;
  local_330.data = (void *)0x0;
  local_330.refcount._0_4_ = 0;
  local_330.refcount._4_4_ = 0;
  local_330.elemsize._0_4_ = 0;
  local_330.elemsize._4_4_ = 0;
  local_330.elempack = 0;
  local_330.dims = 0;
  local_330.w = 0;
  local_330.h = 0;
  local_330.d = 0;
  local_330.c = 0;
  piVar8 = (int *)CONCAT44(local_390.refcount._4_4_,local_390.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_390.allocator == (Allocator *)0x0) {
        if (local_390.data != (void *)0x0) {
          free(local_390.data);
        }
      }
      else {
        (*(local_390.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 2;
        int h_tiles = outh / 2;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 16, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd23_transform_input_pack8_avx(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack8_avx(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd23_transform_output_pack8_avx(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}